

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O0

Matrix * __thiscall SpikeEstimator::getSample(Matrix *__return_storage_ptr__,SpikeEstimator *this)

{
  double dVar1;
  ulong uVar2;
  Matrix local_668;
  Matrix local_568;
  Matrix local_468;
  Matrix local_368;
  uint local_264;
  undefined1 local_260 [4];
  uint i;
  string local_1c8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  Graph a;
  SpikeEstimator *this_local;
  
  a.super_Matrix.sMatrixName.field_2._8_8_ = this;
  Graph::Graph((Graph *)local_118,this->spkLength);
  Parametric::getName_abi_cxx11_(&local_198,(Parametric *)this->spkA);
  std::operator+(&local_178,"O-SPIKE measure ",&local_198);
  std::operator+(&local_158,&local_178," - ");
  Parametric::getName_abi_cxx11_(&local_1c8,(Parametric *)this->spkB);
  std::operator+(&local_138,&local_158,&local_1c8);
  Matrix::setName((Matrix *)local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  Physical::Physical((Physical *)local_260,&((this->super_Estimator).estimatorTime)->super_Physical)
  ;
  Matrix::setPhysical((Matrix *)local_118,0,(Physical *)local_260);
  Physical::~Physical((Physical *)local_260);
  for (local_264 = 0; local_264 < this->spkLength; local_264 = local_264 + 1) {
    uVar2 = (ulong)local_264;
    dVar1 = ((this->super_Estimator).estimatorTime)->dt;
    Matrix::operator[](&local_468,(Matrix *)local_118,local_264);
    Matrix::operator[](&local_368,&local_468,0);
    Matrix::operator=(&local_368,(double)uVar2 * dVar1);
    Matrix::~Matrix(&local_368);
    Matrix::~Matrix(&local_468);
    dVar1 = this->spkSample[local_264];
    Matrix::operator[](&local_668,(Matrix *)local_118,local_264);
    Matrix::operator[](&local_568,&local_668,1);
    Matrix::operator=(&local_568,dVar1);
    Matrix::~Matrix(&local_568);
    Matrix::~Matrix(&local_668);
  }
  Matrix::Matrix(__return_storage_ptr__,(Matrix *)local_118);
  Graph::~Graph((Graph *)local_118);
  return __return_storage_ptr__;
}

Assistant:

Matrix SpikeEstimator::getSample()
{
    Graph a{int(spkLength)};
    a.setName("O-SPIKE measure " + spkA->getName() + " - " + spkB->getName());
    a.setPhysical(0, *estimatorTime );

    for(uint i=0; i<spkLength; i++) {
        a[int(i)][0] = double(i) * estimatorTime->dt;
        a[int(i)][1] = spkSample[i];
    }

    return a;
}